

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.cpp
# Opt level: O0

void __thiscall
CRegexParser::set_trans
          (CRegexParser *this,re_state_id id,re_state_id dest_id,re_recog_type typ,wchar_t ch)

{
  re_tuple_conflict *prVar1;
  re_tuple_conflict *tuple;
  wchar_t ch_local;
  re_recog_type typ_local;
  re_state_id dest_id_local;
  re_state_id id_local;
  CRegexParser *this_local;
  
  if (id != -1) {
    prVar1 = this->tuple_arr_ + id;
    if (prVar1->next_state_1 == -1) {
      prVar1->typ = typ;
      (prVar1->info).ch = ch;
      prVar1->next_state_1 = dest_id;
    }
    else {
      prVar1->next_state_2 = dest_id;
    }
  }
  return;
}

Assistant:

void CRegexParser::set_trans(re_state_id id, re_state_id dest_id,
                             re_recog_type typ, wchar_t ch)
{
    /* ignore invalid states */
    if (id == RE_STATE_INVALID)
        return;
    
    /* 
     *   get the tuple containing the transitions for this state ID - the
     *   state ID is the index of the state's transition tuple in the
     *   array 
     */
    re_tuple *tuple = &tuple_arr_[id];

    /*
     *   If the first state pointer hasn't been set yet, set it to the new
     *   destination.  Otherwise, set the second state pointer.
     *   
     *   Only set the character on setting the first state.  When setting
     *   the second state, we must assume that the character for the state
     *   has already been set, since any given state can have only one
     *   character setting.  
     */
    if (tuple->next_state_1 == RE_STATE_INVALID)
    {
        /* set the transition type and character ID */
        tuple->typ = typ;
        tuple->info.ch = ch;

        /* set the first transition */
        tuple->next_state_1 = dest_id;
    }
    else
    {
        /* 
         *   set only the second transition state - don't set the character
         *   ID or transition type 
         */
        tuple->next_state_2 = dest_id;
    }
}